

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_address_no_zone.c
# Opt level: O0

void * lyplg_type_print_ipv6_address_no_zone
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  LY_ERR LVar1;
  anon_union_24_16_e2776397_for_lyd_value_2 *__cp;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  size_t sVar5;
  char *ret;
  lyd_value_ipv6_address_no_zone *val;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *UNUSED_prefix_data_local;
  LY_VALUE_FORMAT format_local;
  lyd_value *value_local;
  ly_ctx *ctx_local;
  
  __cp = &value->field_2;
  if (format == LY_VALUE_LYB) {
    *dynamic = '\0';
    if (value_len == (size_t *)0x0) {
      return __cp;
    }
    *value_len = 0x10;
    return __cp;
  }
  if (value->_canonical == (char *)0x0) {
    pcVar2 = (char *)malloc(0x2e);
    if (pcVar2 == (char *)0x0) {
      return (void *)0x0;
    }
    pcVar3 = inet_ntop(10,__cp,pcVar2,0x2e);
    if (pcVar3 == (char *)0x0) {
      free(pcVar2);
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      ly_log(ctx,LY_LLERR,LY_ESYS,"Failed to get IPv6 address in string (%s).",pcVar2);
      return (void *)0x0;
    }
    LVar1 = lydict_insert_zc(ctx,pcVar2,&value->_canonical);
    if (LVar1 != LY_SUCCESS) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyplg_type_print_ipv6_address_no_zone");
      return (void *)0x0;
    }
  }
  if (dynamic != (ly_bool *)0x0) {
    *dynamic = '\0';
  }
  if (value_len != (size_t *)0x0) {
    sVar5 = strlen(value->_canonical);
    *value_len = sVar5;
  }
  return value->_canonical;
}

Assistant:

static const void *
lyplg_type_print_ipv6_address_no_zone(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lyd_value_ipv6_address_no_zone *val;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        *dynamic = 0;
        if (value_len) {
            *value_len = sizeof val->addr;
        }
        return &val->addr;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        /* '%' + zone */
        ret = malloc(INET6_ADDRSTRLEN);
        LY_CHECK_RET(!ret, NULL);

        /* get the address in string */
        if (!inet_ntop(AF_INET6, &val->addr, ret, INET6_ADDRSTRLEN)) {
            free(ret);
            LOGERR(ctx, LY_ESYS, "Failed to get IPv6 address in string (%s).", strerror(errno));
            return NULL;
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}